

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O3

void os_set_text_attr(int attr)

{
  char buf [3];
  undefined8 uStack_8;
  
  if ((S_default_win != (osgen_txtwin_t *)0x0) && ((S_default_win->base).txtattr != attr)) {
    uStack_8._0_7_ = CONCAT16((char)attr,CONCAT15(1,(uint5)(uint)attr));
    uStack_8 = (ulong)(uint7)uStack_8;
    ossaddsb(S_default_win,(char *)((long)&uStack_8 + 5),2,1);
  }
  return;
}

Assistant:

void os_set_text_attr(int attr)
{
    osgen_txtwin_t *win;

    /* if there's no default output window, do nothing */
    if ((win = S_default_win) == 0)
        return;

    /* 
     *   if the attributes are different from the old attributes, add an
     *   attribute-change sequence to the display buffer 
     */
    if (attr != win->base.txtattr)
    {
        char buf[3];

        /* set up the attribute-change sequence */
        buf[0] = OSGEN_ATTR;
        buf[1] = (char)attr;
        ossaddsb(win, buf, 2, TRUE);
    }
}